

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshvolume.cpp
# Opt level: O2

float computeMeshVolume(float *vertices,uint tcount,uint *indices)

{
  bool bVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  
  fVar3 = 0.0;
  while (bVar1 = tcount != 0, tcount = tcount - 1, bVar1) {
    fVar4 = det(vertices + *indices * 3,vertices + indices[1] * 3,vertices + indices[2] * 3);
    indices = indices + 3;
    fVar3 = fVar3 + fVar4;
  }
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(ZEXT416((uint)(fVar3 * 0.16666667)),auVar2);
  auVar2 = vmaxss_avx(auVar2,ZEXT416((uint)(fVar3 * 0.16666667)));
  return auVar2._0_4_;
}

Assistant:

float computeMeshVolume(const float *vertices,unsigned int tcount,const unsigned int *indices)
{
	float volume = 0;

	for (unsigned int i=0; i<tcount; i++,indices+=3)
	{

		const float *p1 = &vertices[ indices[0]*3 ];
		const float *p2 = &vertices[ indices[1]*3 ];
		const float *p3 = &vertices[ indices[2]*3 ];

		volume+=det(p1,p2,p3); // compute the volume of the tetrahedron relative to the origin.
	}

	volume*=(1.0f/6.0f);
	if ( volume < 0 ) 
		volume*=-1;
	return volume;
}